

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tone.cpp
# Opt level: O1

void __thiscall cubeb_tone_Test::~cubeb_tone_Test(cubeb_tone_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cubeb, tone)
{
  cubeb *ctx;
  cubeb_stream *stream;
  cubeb_stream_params params;
  int r;

  r = common_init(&ctx, "Cubeb tone example");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  params.format = STREAM_FORMAT;
  params.rate = SAMPLE_FREQUENCY;
  params.channels = 1;
  params.layout = CUBEB_LAYOUT_MONO;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  std::unique_ptr<cb_user_data> user_data(new cb_user_data());
  ASSERT_TRUE(!!user_data) << "Error allocating user data";

  user_data->position = 0;

  r = cubeb_stream_init(ctx, &stream, "Cubeb tone (mono)", NULL, NULL, NULL, &params,
                        4096, data_cb_tone, state_cb_tone, user_data.get());
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";

  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_stream_start(stream);
  delay(5000);
  cubeb_stream_stop(stream);

  ASSERT_TRUE(user_data->position.load());
}